

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::RsWeightClauseSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,RsWeightClauseSyntax *this,size_t index)

{
  Token token;
  SyntaxNode *node;
  size_t index_local;
  RsWeightClauseSyntax *this_local;
  
  if (index == 0) {
    token.kind = (this->colonEqual).kind;
    token._2_1_ = (this->colonEqual).field_0x2;
    token.numFlags.raw = (this->colonEqual).numFlags.raw;
    token.rawLen = (this->colonEqual).rawLen;
    token.info = (this->colonEqual).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 1) {
    node = &not_null<slang::syntax::ExpressionSyntax_*>::get(&this->weight)->super_SyntaxNode;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,node);
  }
  else if (index == 2) {
    ConstTokenOrSyntax::ConstTokenOrSyntax
              (__return_storage_ptr__,&this->codeBlock->super_SyntaxNode);
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax RsWeightClauseSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return colonEqual;
        case 1: return weight.get();
        case 2: return codeBlock;
        default: return nullptr;
    }
}